

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

int VP8DecodeMB(VP8Decoder *dec,VP8BitReader *token_br)

{
  VP8MBData *pVVar1;
  byte bVar2;
  int iVar3;
  VP8FInfo VVar4;
  VP8MB *pVVar5;
  VP8FInfo *pVVar6;
  uint8_t uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  VP8MBData *__s;
  long lVar21;
  bool bVar22;
  uint32_t local_b0;
  VP8BandProbas *(*local_a8) [17];
  VP8MBData *local_98;
  short local_58 [20];
  
  pVVar5 = dec->mb_info;
  iVar3 = dec->mb_x;
  __s = dec->mb_data + iVar3;
  if ((dec->use_skip_proba == 0) || (__s->skip == '\0')) {
    bVar2 = __s->segment;
    iVar9 = 0;
    memset(__s,0,0x300);
    if (__s->is_i4x4 == '\0') {
      local_58[8] = 0;
      local_58[9] = 0;
      local_58[10] = 0;
      local_58[0xb] = 0;
      local_58[0xc] = 0;
      local_58[0xd] = 0;
      local_58[0xe] = 0;
      local_58[0xf] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      iVar9 = (*GetCoeffs)(token_br,(dec->proba).bands_ptr[1],
                           (uint)pVVar5[-1].nz_dc + (uint)pVVar5[iVar3].nz_dc,dec->dqm[bVar2].y2_mat
                           ,0,local_58);
      pVVar5[-1].nz_dc = 0 < iVar9;
      pVVar5[iVar3].nz_dc = 0 < iVar9;
      if (iVar9 < 2) {
        for (uVar12 = 0; uVar12 < 0x100; uVar12 = uVar12 + 0x10) {
          __s->coeffs[uVar12] = (int16_t)((int)local_58[0] + 3U >> 3);
        }
      }
      else {
        (*VP8TransformWHT)(local_58,__s->coeffs);
      }
      local_a8 = (dec->proba).bands_ptr;
      iVar9 = 1;
    }
    else {
      local_a8 = (dec->proba).bands_ptr + 3;
    }
    bVar17 = pVVar5[iVar3].nz & 0xf;
    uVar14 = (uint)(pVVar5[-1].nz & 0xf);
    local_b0 = 0;
    local_98 = __s;
    for (iVar10 = 0; iVar10 != 4; iVar10 = iVar10 + 1) {
      uVar13 = uVar14 & 1;
      uVar19 = 0;
      for (lVar21 = 0; pVVar1 = (VP8MBData *)((long)local_98->coeffs + lVar21), (int)lVar21 != 0x80;
          lVar21 = lVar21 + 0x20) {
        iVar8 = (*GetCoeffs)(token_br,*local_a8,uVar13 + (bVar17 & 1),dec->dqm[bVar2].y1_mat,iVar9,
                             (int16_t *)pVVar1);
        uVar13 = (uint)(iVar9 < iVar8);
        bVar17 = bVar17 >> 1 | (iVar9 < iVar8) << 7;
        uVar20 = (uint)(pVVar1->coeffs[0] != 0);
        if (1 < iVar8) {
          uVar20 = 2;
        }
        if (3 < iVar8) {
          uVar20 = 3;
        }
        uVar19 = uVar20 + uVar19 * 4;
      }
      bVar17 = bVar17 >> 4;
      uVar14 = uVar13 << 7 | uVar14 >> 1;
      local_b0 = uVar19 | local_b0 << 8;
      local_98 = pVVar1;
    }
    uVar13 = (uint)bVar17;
    uVar14 = uVar14 >> 4;
    uVar20 = 0;
    for (uVar19 = 0; uVar19 < 4; uVar19 = uVar19 + 2) {
      bVar17 = (byte)uVar19;
      uVar18 = (uint)(pVVar5[iVar3].nz >> (bVar17 & 0x1f | 4));
      uVar15 = (uint)(pVVar5[-1].nz >> (bVar17 & 0x1f | 4));
      iVar10 = 0;
      for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
        uVar16 = uVar15 & 1;
        for (lVar21 = 0; pVVar1 = (VP8MBData *)((long)local_98->coeffs + lVar21),
            (int)lVar21 != 0x40; lVar21 = lVar21 + 0x20) {
          iVar8 = (*GetCoeffs)(token_br,(dec->proba).bands_ptr[2],uVar16 + (uVar18 & 1),
                               dec->dqm[bVar2].uv_mat,0,(int16_t *)pVVar1);
          uVar16 = (uint)(0 < iVar8);
          uVar18 = uVar18 >> 1 | (uint)(0 < iVar8) * 8;
          uVar11 = (uint)(pVVar1->coeffs[0] != 0);
          if (1 < iVar8) {
            uVar11 = 2;
          }
          if (3 < iVar8) {
            uVar11 = 3;
          }
          iVar10 = uVar11 + iVar10 * 4;
        }
        uVar18 = uVar18 >> 2;
        uVar15 = uVar16 << 5 | uVar15 >> 1;
        local_98 = pVVar1;
      }
      uVar20 = iVar10 << (bVar17 * '\x04' & 0x1f) | uVar20;
      uVar13 = uVar13 | (uVar18 << 4) << (bVar17 & 0x1f);
      uVar14 = uVar14 | (uVar15 & 0xf0) << (bVar17 & 0x1f);
    }
    pVVar5[iVar3].nz = (uint8_t)uVar13;
    pVVar5[-1].nz = (uint8_t)uVar14;
    __s->non_zero_y = local_b0;
    __s->non_zero_uv = uVar20;
    if ((uVar20 & 0xaaaa) == 0) {
      uVar7 = (uint8_t)dec->dqm[bVar2].dither;
    }
    else {
      uVar7 = '\0';
    }
    __s->dither = uVar7;
    bVar22 = uVar20 != 0 || local_b0 != 0;
  }
  else {
    pVVar5[iVar3].nz = '\0';
    pVVar5[-1].nz = '\0';
    if (__s->is_i4x4 == '\0') {
      pVVar5[iVar3].nz_dc = '\0';
      pVVar5[-1].nz_dc = '\0';
    }
    __s->dither = '\0';
    __s->non_zero_y = 0;
    __s->non_zero_uv = 0;
    bVar22 = false;
  }
  if (0 < dec->filter_type) {
    pVVar6 = dec->f_info;
    iVar3 = dec->mb_x;
    VVar4 = dec->fstrengths[__s->segment][__s->is_i4x4];
    pVVar6[iVar3] = VVar4;
    pVVar6[iVar3].f_inner = bVar22 | VVar4.f_inner;
  }
  return (int)(token_br->eof == 0);
}

Assistant:

int VP8DecodeMB(VP8Decoder* const dec, VP8BitReader* const token_br) {
  VP8MB* const left = dec->mb_info - 1;
  VP8MB* const mb = dec->mb_info + dec->mb_x;
  VP8MBData* const block = dec->mb_data + dec->mb_x;
  int skip = dec->use_skip_proba ? block->skip : 0;

  if (!skip) {
    skip = ParseResiduals(dec, mb, token_br);
  } else {
    left->nz = mb->nz = 0;
    if (!block->is_i4x4) {
      left->nz_dc = mb->nz_dc = 0;
    }
    block->non_zero_y = 0;
    block->non_zero_uv = 0;
    block->dither = 0;
  }

  if (dec->filter_type > 0) {  // store filter info
    VP8FInfo* const finfo = dec->f_info + dec->mb_x;
    *finfo = dec->fstrengths[block->segment][block->is_i4x4];
    finfo->f_inner |= !skip;
  }

  return !token_br->eof;
}